

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_overlap(chunk_conflict *c,loc centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  wchar_t y1;
  wchar_t x1;
  wchar_t y2;
  wchar_t x2;
  wchar_t y1_00;
  wchar_t x1_00;
  wchar_t y2_00;
  wchar_t x2_00;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_58;
  wchar_t local_50;
  wchar_t light;
  wchar_t width;
  wchar_t height;
  wchar_t x2b;
  wchar_t y2b;
  wchar_t x1b;
  wchar_t y1b;
  wchar_t x2a;
  wchar_t y2a;
  wchar_t x1a;
  wchar_t y1a;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  iVar3 = c->depth;
  unique0x10000229 = centre;
  uVar2 = Rand_div(0x19);
  local_50 = (wchar_t)(iVar3 <= (int)(uVar2 + 1));
  uVar2 = Rand_div(4);
  iVar3 = uVar2 + 1;
  uVar2 = Rand_div(0xb);
  iVar4 = uVar2 + 1;
  uVar2 = Rand_div(3);
  iVar5 = uVar2 + 1;
  uVar2 = Rand_div(10);
  iVar6 = uVar2 + 1;
  uVar2 = Rand_div(3);
  iVar7 = uVar2 + 1;
  uVar2 = Rand_div(10);
  iVar8 = uVar2 + 1;
  uVar2 = Rand_div(4);
  iVar9 = uVar2 + 1;
  uVar2 = Rand_div(0xb);
  iVar10 = uVar2 + 1;
  local_58 = iVar3;
  if (iVar3 < iVar5) {
    local_58 = iVar5;
  }
  local_60 = iVar7;
  if (iVar7 < iVar9) {
    local_60 = iVar9;
  }
  if (local_58 < local_60) {
    local_64 = iVar7;
    if (iVar7 < iVar9) {
      local_64 = iVar9;
    }
    local_68 = local_64;
  }
  else {
    local_6c = iVar3;
    if (iVar3 < iVar5) {
      local_6c = iVar5;
    }
    local_68 = local_6c;
  }
  local_70 = iVar4;
  if (iVar4 < iVar6) {
    local_70 = iVar6;
  }
  local_78 = iVar8;
  if (iVar8 < iVar10) {
    local_78 = iVar10;
  }
  if (local_70 < local_78) {
    local_7c = iVar8;
    if (iVar8 < iVar10) {
      local_7c = iVar10;
    }
    local_80 = local_7c;
  }
  else {
    local_84 = iVar4;
    if (iVar4 < iVar6) {
      local_84 = iVar6;
    }
    local_80 = local_84;
  }
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_68 * 2 + L'\x03',local_80 * 2 + L'\x03');
  if (((iStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var1 = find_space((loc *)((long)&c_local + 4),local_68 * 2 + L'\x03',local_80 * 2 + L'\x03'),
     _Var1)) {
    y1 = iStack_10 - iVar3;
    x1 = c_local._4_4_ - iVar4;
    y2 = iStack_10 + iVar5;
    x2 = c_local._4_4_ + iVar6;
    y1_00 = iStack_10 - iVar7;
    x1_00 = c_local._4_4_ - iVar8;
    y2_00 = iStack_10 + iVar9;
    x2_00 = c_local._4_4_ + iVar10;
    generate_room(c,y1 + L'\xffffffff',x1 + L'\xffffffff',y2 + L'\x01',x2 + L'\x01',local_50);
    generate_room(c,y1_00 + L'\xffffffff',x1_00 + L'\xffffffff',y2_00 + L'\x01',x2_00 + L'\x01',
                  local_50);
    draw_rectangle(c,y1 + L'\xffffffff',x1 + L'\xffffffff',y2 + L'\x01',x2 + L'\x01',FEAT_GRANITE,
                   L'\f',false);
    draw_rectangle(c,y1_00 + L'\xffffffff',x1_00 + L'\xffffffff',y2_00 + L'\x01',x2_00 + L'\x01',
                   FEAT_GRANITE,L'\f',false);
    fill_rectangle(c,y1,x1,y2,x2,FEAT_FLOOR,L'\0');
    fill_rectangle(c,y1_00,x1_00,y2_00,x2_00,FEAT_FLOOR,L'\0');
    centre_local.x._3_1_ = true;
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_overlap(struct chunk *c, struct loc centre, int rating)
{
	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;
	int height, width;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Determine extents of room (a) */
	y1a = randint1(4);
	x1a = randint1(11);
	y2a = randint1(3);
	x2a = randint1(10);

	/* Determine extents of room (b) */
	y1b = randint1(3);
	x1b = randint1(10);
	y2b = randint1(4);
	x2b = randint1(11);

	/* Calculate height and width */
	height = 2 * MAX(MAX(y1a, y2a), MAX(y1b, y2b)) + 1;
	width = 2 * MAX(MAX(x1a, x2a), MAX(x1b, x2b)) + 1;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (a) */
	y1a = centre.y - y1a;
	x1a = centre.x - x1a;
	y2a = centre.y + y2a;
	x2a = centre.x + x2a;

	/* locate room (b) */
	y1b = centre.y - y1b;
	x1b = centre.x - x1b;
	y2b = centre.y + y2b;
	x2b = centre.x + x2b;

	/* Generate new room (a) */
	generate_room(c, y1a-1, x1a-1, y2a+1, x2a+1, light);

	/* Generate new room (b) */
	generate_room(c, y1b-1, x1b-1, y2b+1, x2b+1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a-1, x1a-1, y2a+1, x2a+1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b-1, x1b-1, y2b+1, x2b+1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	return true;
}